

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunchReporter.cxx
# Opt level: O0

void __thiscall cmCTestLaunchReporter::~cmCTestLaunchReporter(cmCTestLaunchReporter *this)

{
  cmCTestLaunchReporter *this_local;
  
  if ((this->Passthru & 1U) == 0) {
    cmsys::SystemTools::RemoveFile(&this->LogOut);
    cmsys::SystemTools::RemoveFile(&this->LogErr);
  }
  std::__cxx11::string::~string((string *)&this->SourceDir);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::~vector
            (&this->RegexWarningSuppress);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::~vector
            (&this->RegexWarning);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->Labels);
  std::__cxx11::string::~string((string *)&this->LogErr);
  std::__cxx11::string::~string((string *)&this->LogOut);
  std::__cxx11::string::~string((string *)&this->LogDir);
  std::__cxx11::string::~string((string *)&this->LogHash);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->RealArgs);
  std::__cxx11::string::~string((string *)&this->CWD);
  std::__cxx11::string::~string((string *)&this->OptionFilterPrefix);
  std::__cxx11::string::~string((string *)&this->OptionBuildDir);
  std::__cxx11::string::~string((string *)&this->OptionTargetType);
  std::__cxx11::string::~string((string *)&this->OptionTargetName);
  std::__cxx11::string::~string((string *)&this->OptionLanguage);
  std::__cxx11::string::~string((string *)&this->OptionSource);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmCTestLaunchReporter::~cmCTestLaunchReporter()
{
  if (!this->Passthru) {
    cmSystemTools::RemoveFile(this->LogOut);
    cmSystemTools::RemoveFile(this->LogErr);
  }
}